

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::Deserializer::List::ReadElement<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
          (List *this)

{
  element_type *in_RDI;
  type tVar1;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar2;
  Deserializer *in_stack_00000038;
  
  tVar1 = Read<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>(in_stack_00000038);
  sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       tVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Deserializer::List::ReadElement() {
	return deserializer.Read<T>();
}